

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::Tree::_copy_props_wo_key(Tree *this,size_t dst_,Tree *that_tree,size_t src_)

{
  csubstr *pcVar1;
  NodeData *pNVar2;
  NodeData *pNVar3;
  code *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  bool bVar10;
  
  if ((dst_ == 0xffffffffffffffff) || (this->m_cap <= dst_)) {
    if ((s_error_flags & 1) != 0) {
      bVar10 = is_debugger_attached();
      if (bVar10) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0024dab8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar2 = this->m_buf;
  if ((src_ == 0xffffffffffffffff) || (that_tree->m_cap <= src_)) {
    if ((s_error_flags & 1) != 0) {
      bVar10 = is_debugger_attached();
      if (bVar10) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0024dab8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar3 = that_tree->m_buf;
  pNVar2[dst_].m_type.type =
       (ulong)((uint)pNVar2[dst_].m_type.type & 0x2542) | pNVar3[src_].m_type.type & ~_KEYMASK;
  sVar5 = pNVar3[src_].m_val.tag.len;
  pcVar1 = &pNVar3[src_].m_val.scalar;
  pcVar6 = pcVar1->str;
  sVar7 = pcVar1->len;
  pcVar1 = &pNVar3[src_].m_val.anchor;
  pcVar8 = pcVar1->str;
  sVar9 = pcVar1->len;
  pNVar2[dst_].m_val.tag.str = pNVar3[src_].m_val.tag.str;
  pNVar2[dst_].m_val.tag.len = sVar5;
  pcVar1 = &pNVar2[dst_].m_val.scalar;
  pcVar1->str = pcVar6;
  pcVar1->len = sVar7;
  pcVar1 = &pNVar2[dst_].m_val.anchor;
  pcVar1->str = pcVar8;
  pcVar1->len = sVar9;
  return;
}

Assistant:

void _copy_props_wo_key(size_t dst_, Tree const* that_tree, size_t src_)
    {
        auto      & C4_RESTRICT dst = *_p(dst_);
        auto const& C4_RESTRICT src = *that_tree->_p(src_);
        dst.m_type = (src.m_type & ~_KEYMASK) | (dst.m_type & _KEYMASK);
        dst.m_val  = src.m_val;
    }